

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdstring.cpp
# Opt level: O2

SQInteger sqstd_register_stringlib(HSQUIRRELVM v)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  
  sq_pushstring(v,"regexp",0xffffffffffffffff);
  sq_newclass(v,0);
  rex_typetag = rexobj_funcs;
  sq_settypetag(v,0xffffffffffffffff,rexobj_funcs);
  for (lVar3 = 0x18; lVar3 != 0xd8; lVar3 = lVar3 + 0x20) {
    uVar1 = *(undefined8 *)((long)&_stream_methods[10].f + lVar3);
    uVar2 = *(undefined8 *)((long)&_stream_methods[10].nparamscheck + lVar3);
    sq_pushstring(v,uVar1,0xffffffffffffffff);
    sq_newclosure(v,uVar2,0);
    sq_setparamscheck(v,*(undefined8 *)((long)&_stream_methods[10].typemask + lVar3),
                      *(undefined8 *)((long)&rexobj_funcs[0].name + lVar3));
    sq_setnativeclosurename(v,0xffffffffffffffff,uVar1);
    sq_newslot(v,0xfffffffffffffffd,0);
  }
  sq_newslot(v,0xfffffffffffffffd,0);
  for (lVar3 = 0x18; lVar3 != 0x138; lVar3 = lVar3 + 0x20) {
    uVar1 = *(undefined8 *)((long)&rexobj_funcs[6].f + lVar3);
    uVar2 = *(undefined8 *)((long)&rexobj_funcs[6].nparamscheck + lVar3);
    sq_pushstring(v,uVar1,0xffffffffffffffff);
    sq_newclosure(v,uVar2,0);
    sq_setparamscheck(v,*(undefined8 *)((long)&rexobj_funcs[6].typemask + lVar3),
                      *(undefined8 *)((long)&stringlib_funcs[0].name + lVar3));
    sq_setnativeclosurename(v,0xffffffffffffffff,uVar1);
    sq_newslot(v,0xfffffffffffffffd,0);
  }
  return 1;
}

Assistant:

SQInteger sqstd_register_stringlib(HSQUIRRELVM v)
{
    sq_pushstring(v,_SC("regexp"),-1);
    sq_newclass(v,SQFalse);
	rex_typetag = (SQUserPointer)rexobj_funcs;
	sq_settypetag(v, -1, rex_typetag);
    SQInteger i = 0;
    while(rexobj_funcs[i].name != 0) {
        const SQRegFunction &f = rexobj_funcs[i];
        sq_pushstring(v,f.name,-1);
        sq_newclosure(v,f.f,0);
        sq_setparamscheck(v,f.nparamscheck,f.typemask);
        sq_setnativeclosurename(v,-1,f.name);
        sq_newslot(v,-3,SQFalse);
        i++;
    }
    sq_newslot(v,-3,SQFalse);

    i = 0;
    while(stringlib_funcs[i].name!=0)
    {
        sq_pushstring(v,stringlib_funcs[i].name,-1);
        sq_newclosure(v,stringlib_funcs[i].f,0);
        sq_setparamscheck(v,stringlib_funcs[i].nparamscheck,stringlib_funcs[i].typemask);
        sq_setnativeclosurename(v,-1,stringlib_funcs[i].name);
        sq_newslot(v,-3,SQFalse);
        i++;
    }
    return 1;
}